

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_string_with_string_literal(void)

{
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2db [2];
  undefined1 local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29b [2];
  undefined1 local_299;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25b [2];
  undefined1 local_259;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_21b [2];
  undefined1 local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19b [2];
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,"alpha");
  local_a[0] = trial::dynamic::operator<(&local_48,(char (*) [6])"alpha");
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") < \"alpha\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ba7,"void relational_suite::compare_string_with_string_literal()",local_a,&local_49
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98,"alpha");
  local_5e[0] = trial::dynamic::operator<=(&local_98,(char (*) [6])"alpha");
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") <= \"alpha\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ba8,"void relational_suite::compare_string_with_string_literal()",local_5e,
             &local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,"alpha");
  local_9b[0] = trial::dynamic::operator>(&local_d8,(char (*) [6])"alpha");
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") > \"alpha\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ba9,"void relational_suite::compare_string_with_string_literal()",local_9b,
             &local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118,"alpha");
  local_db[0] = trial::dynamic::operator>=(&local_118,(char (*) [6])"alpha");
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") >= \"alpha\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1baa,"void relational_suite::compare_string_with_string_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,"alpha");
  local_11b[0] = trial::dynamic::operator<(&local_158,(char (*) [5])"zulu");
  local_159 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") < \"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1bac,"void relational_suite::compare_string_with_string_literal()",local_11b,
             &local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,"alpha");
  local_15b[0] = trial::dynamic::operator<=(&local_198,(char (*) [5])"zulu");
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") <= \"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1bad,"void relational_suite::compare_string_with_string_literal()",local_15b,
             &local_199);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1d8,"alpha");
  local_19b[0] = trial::dynamic::operator>(&local_1d8,(char (*) [5])"zulu");
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") > \"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1bae,"void relational_suite::compare_string_with_string_literal()",local_19b,
             &local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_218,"alpha");
  local_1db[0] = trial::dynamic::operator>=(&local_218,(char (*) [5])"zulu");
  local_219 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"alpha\") >= \"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1baf,"void relational_suite::compare_string_with_string_literal()",local_1db,
             &local_219);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_258,"zulu");
  local_21b[0] = trial::dynamic::operator<(&local_258,(char (*) [6])"alpha");
  local_259 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"zulu\") < \"alpha\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1bb1,"void relational_suite::compare_string_with_string_literal()",local_21b,
             &local_259);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_298,"zulu");
  local_25b[0] = trial::dynamic::operator<=(&local_298,(char (*) [6])"alpha");
  local_299 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"zulu\") <= \"alpha\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1bb2,"void relational_suite::compare_string_with_string_literal()",local_25b,
             &local_299);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2d8,"zulu");
  local_29b[0] = trial::dynamic::operator>(&local_2d8,(char (*) [6])"alpha");
  local_2d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"zulu\") > \"alpha\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1bb3,"void relational_suite::compare_string_with_string_literal()",local_29b,
             &local_2d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,"zulu");
  local_2db[0] = trial::dynamic::operator>=(&local_318,(char (*) [6])"alpha");
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(\"zulu\") >= \"alpha\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1bb4,"void relational_suite::compare_string_with_string_literal()",local_2db,
             &local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  return;
}

Assistant:

void compare_string_with_string_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") < "alpha", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") <= "alpha", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") > "alpha", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") >= "alpha", true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") < "zulu", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") <= "zulu", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") > "zulu", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("alpha") >= "zulu", false);

    TRIAL_PROTOCOL_TEST_EQUAL(variable("zulu") < "alpha", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("zulu") <= "alpha", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("zulu") > "alpha", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable("zulu") >= "alpha", true);
}